

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

bool __thiscall
sf::priv::RenderTextureImplFBO::create
          (RenderTextureImplFBO *this,uint width,uint height,uint textureId,
          ContextSettings *settings)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  Uint64 UVar3;
  GLuint local_68;
  GLuint local_64;
  GLint drawFramebuffer;
  GLint readFramebuffer;
  GLuint depthStencil_3;
  GLuint depthStencil_2;
  GLuint color;
  GLuint depthStencil_1;
  GLuint depthStencil;
  GLint samples;
  TransientContextLock local_31;
  ContextSettings *pCStack_30;
  TransientContextLock lock;
  ContextSettings *settings_local;
  uint textureId_local;
  uint height_local;
  uint width_local;
  RenderTextureImplFBO *this_local;
  
  this->m_width = width;
  this->m_height = height;
  pCStack_30 = settings;
  GlResource::TransientContextLock::TransientContextLock(&local_31);
  ensureExtensionsInit();
  if ((pCStack_30->antialiasingLevel == 0) ||
     ((sfogl_ext_EXT_framebuffer_multisample != 0 && (sfogl_ext_EXT_framebuffer_blit != 0)))) {
    if ((pCStack_30->stencilBits == 0) || (sfogl_ext_EXT_packed_depth_stencil != 0)) {
      if (pCStack_30->antialiasingLevel != 0) {
        depthStencil_1 = 0;
        glGetIntegerv(0x8d57,&depthStencil_1);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0xed,"glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples)");
        if (depthStencil_1 < pCStack_30->antialiasingLevel) {
          poVar2 = err();
          std::operator<<(poVar2,
                          "Impossible to create render texture (unsupported anti-aliasing level)");
          poVar2 = err();
          poVar2 = std::operator<<(poVar2," Requested: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,pCStack_30->antialiasingLevel);
          poVar2 = std::operator<<(poVar2," Maximum supported: ");
          this_00 = (void *)std::ostream::operator<<(poVar2,depthStencil_1);
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          depthStencil = 1;
          goto LAB_00184601;
        }
      }
      if (pCStack_30->antialiasingLevel == 0) {
        if (pCStack_30->stencilBits == 0) {
          if (pCStack_30->depthBits != 0) {
            depthStencil_2 = 0;
            (*sf_ptrc_glGenRenderbuffersEXT)(1,&depthStencil_2);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x11a,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
            this->m_depthStencilBuffer = depthStencil_2;
            if (this->m_depthStencilBuffer == 0) {
              poVar2 = err();
              poVar2 = std::operator<<(poVar2,
                                       "Impossible to create render texture (failed to create the attached depth buffer)"
                                      );
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = 0;
              depthStencil = 1;
              goto LAB_00184601;
            }
            (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_depthStencilBuffer);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x121,
                         "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
            (*sf_ptrc_glRenderbufferStorageEXT)(0x8d41,0x1902,width,height);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x122,
                         "GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, width, height)"
                        );
          }
        }
        else {
          color = 0;
          (*sf_ptrc_glGenRenderbuffersEXT)(1,&color);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x103,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
          this->m_depthStencilBuffer = color;
          if (this->m_depthStencilBuffer == 0) {
            poVar2 = err();
            poVar2 = std::operator<<(poVar2,
                                     "Impossible to create render texture (failed to create the attached depth/stencil buffer)"
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = 0;
            depthStencil = 1;
            goto LAB_00184601;
          }
          (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_depthStencilBuffer);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x10a,
                       "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
          (*sf_ptrc_glRenderbufferStorageEXT)(0x8d41,0x88f0,width,height);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x10b,
                       "GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, width, height)"
                      );
          this->m_stencil = true;
        }
      }
      else {
        depthStencil_3 = 0;
        (*sf_ptrc_glGenRenderbuffersEXT)(1,&depthStencil_3);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,300,"GLEXT_glGenRenderbuffers(1, &color)");
        this->m_colorBuffer = depthStencil_3;
        if (this->m_colorBuffer == 0) {
          poVar2 = err();
          poVar2 = std::operator<<(poVar2,
                                   "Impossible to create render texture (failed to create the attached multisample color buffer)"
                                  );
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = 0;
          depthStencil = 1;
          goto LAB_00184601;
        }
        (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_colorBuffer);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x133,"GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer)");
        (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                  (0x8d41,pCStack_30->antialiasingLevel,0x1908,width,height);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x134,
                     "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GL_RGBA, width, height)"
                    );
        if (pCStack_30->stencilBits == 0) {
          if (pCStack_30->depthBits != 0) {
            drawFramebuffer = 0;
            (*sf_ptrc_glGenRenderbuffersEXT)(1,(GLuint *)&drawFramebuffer);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x149,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
            this->m_depthStencilBuffer = drawFramebuffer;
            if (this->m_depthStencilBuffer == 0) {
              poVar2 = err();
              poVar2 = std::operator<<(poVar2,
                                       "Impossible to create render texture (failed to create the attached multisample depth buffer)"
                                      );
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = 0;
              depthStencil = 1;
              goto LAB_00184601;
            }
            (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_depthStencilBuffer);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x150,
                         "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
            (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                      (0x8d41,pCStack_30->antialiasingLevel,0x1902,width,height);
            glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                         ,0x151,
                         "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH_COMPONENT, width, height)"
                        );
          }
        }
        else {
          readFramebuffer = 0;
          (*sf_ptrc_glGenRenderbuffersEXT)(1,(GLuint *)&readFramebuffer);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x13a,"GLEXT_glGenRenderbuffers(1, &depthStencil)");
          this->m_depthStencilBuffer = readFramebuffer;
          if (this->m_depthStencilBuffer == 0) {
            poVar2 = err();
            poVar2 = std::operator<<(poVar2,
                                     "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)"
                                    );
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = 0;
            depthStencil = 1;
            goto LAB_00184601;
          }
          (*sf_ptrc_glBindRenderbufferEXT)(0x8d41,this->m_depthStencilBuffer);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x141,
                       "GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer)");
          (*sf_ptrc_glRenderbufferStorageMultisampleEXT)
                    (0x8d41,pCStack_30->antialiasingLevel,0x88f0,width,height);
          glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                       ,0x142,
                       "GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH24_STENCIL8, width, height)"
                      );
          this->m_stencil = true;
        }
        this->m_multisample = true;
      }
      depthStencil = 0;
    }
    else {
      this_local._7_1_ = 0;
      depthStencil = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    depthStencil = 1;
  }
LAB_00184601:
  GlResource::TransientContextLock::~TransientContextLock(&local_31);
  if (depthStencil == 0) {
    this->m_textureId = textureId;
    UVar3 = Context::getActiveContextId();
    if (UVar3 == 0) {
      this_local._7_1_ = 1;
    }
    else {
      local_64 = 0;
      local_68 = 0;
      glGetIntegerv(0x8caa,&local_64);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x16d,"glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer)");
      glGetIntegerv(0x8ca6,&local_68);
      glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                   ,0x16e,"glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer)");
      bVar1 = createFrameBuffer(this);
      if (bVar1) {
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,local_64);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x173,"GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer)");
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,local_68);
        glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/RenderTextureImplFBO.cpp"
                     ,0x174,"GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer)");
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderTextureImplFBO::create(unsigned int width, unsigned int height, unsigned int textureId, const ContextSettings& settings)
{
    // Store the dimensions
    m_width = width;
    m_height = height;

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        if (settings.antialiasingLevel && !(GLEXT_framebuffer_multisample && GLEXT_framebuffer_blit))
            return false;

        if (settings.stencilBits && !GLEXT_packed_depth_stencil)
            return false;

#ifndef SFML_OPENGL_ES

        // Check if the requested anti-aliasing level is supported
        if (settings.antialiasingLevel)
        {
            GLint samples = 0;
            glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

            if (settings.antialiasingLevel > static_cast<unsigned int>(samples))
            {
                err() << "Impossible to create render texture (unsupported anti-aliasing level)";
                err() << " Requested: " << settings.antialiasingLevel << " Maximum supported: " << samples << std::endl;
                return false;
            }
        }

#endif


        if (!settings.antialiasingLevel)
        {
            // Create the depth/stencil buffer if requested
            if (settings.stencilBits)
            {

#ifndef SFML_OPENGL_ES

                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, width, height));

#else

                err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                return false;

#endif // SFML_OPENGL_ES

                m_stencil = true;

            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, width, height));
            }
        }
        else
        {

#ifndef SFML_OPENGL_ES

            // Create the multisample color buffer
            GLuint color = 0;
            glCheck(GLEXT_glGenRenderbuffers(1, &color));
            m_colorBuffer = static_cast<unsigned int>(color);
            if (!m_colorBuffer)
            {
                err() << "Impossible to create render texture (failed to create the attached multisample color buffer)" << std::endl;
                return false;
            }
            glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
            glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GL_RGBA, width, height));

            // Create the multisample depth/stencil buffer if requested
            if (settings.stencilBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH24_STENCIL8, width, height));

                m_stencil = true;
            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = static_cast<unsigned int>(depthStencil);
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, settings.antialiasingLevel, GLEXT_GL_DEPTH_COMPONENT, width, height));
            }

#else

            err() << "Impossible to create render texture (failed to create the multisample render buffers)" << std::endl;
            return false;

#endif // SFML_OPENGL_ES

            m_multisample = true;

        }
    }

    // Save our texture ID in order to be able to attach it to an FBO at any time
    m_textureId = textureId;

    // We can't create an FBO now if there is no active context
    if (!Context::getActiveContextId())
        return true;

#ifndef SFML_OPENGL_ES

    // Save the current bindings so we can restore them after we are done
    GLint readFramebuffer = 0;
    GLint drawFramebuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
    glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer));

        return true;
    }

#else

    // Save the current binding so we can restore them after we are done
    GLint frameBuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &frameBuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, frameBuffer));

        return true;
    }

#endif

    return false;
}